

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::OrId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,OrConstraint *con,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
          *prepro)

{
  bool bVar1;
  Arguments *pAVar2;
  size_type sVar3;
  reference pvVar4;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
  *in_RDX;
  long in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>
  *in_stack_00000018;
  ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000020;
  int x;
  iterator __end4;
  iterator __begin4;
  Arguments *__range4;
  vector<int,_std::allocator<int>_> arg1;
  pair<int,_int> n01;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
  *local_50;
  pair<int,_int> local_20;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
  *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
  ::narrow_result_bounds
            (in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
             (double)in_stack_ffffffffffffff70);
  PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
  ::set_result_type(local_18,INTEGER);
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>::
  GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                *)(local_10 + 0x28));
  local_20 = count_fixed_01<std::vector<int,std::allocator<int>>>
                       ((ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDI);
  if (local_20.second == 0) {
    pAVar2 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
             ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                             *)(local_10 + 0x28));
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pAVar2);
    if ((int)sVar3 == local_20.first) {
      PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
      ::narrow_result_bounds
                (in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
                 (double)in_stack_ffffffffffffff70);
    }
    else {
      if (local_20.first != 0) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x2198a9);
        pAVar2 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                 ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                                 *)(local_10 + 0x28));
        std::vector<int,_std::allocator<int>_>::size(pAVar2);
        std::vector<int,_std::allocator<int>_>::reserve
                  (in_stack_ffffffffffffffa0,
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffff80 =
             (PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
              *)CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                                *)(local_10 + 0x28));
        local_50 = in_stack_ffffffffffffff80;
        local_58._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
        std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffff70,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffff68), bVar1) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_58);
          in_stack_ffffffffffffff78 =
               (value_type *)
               FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::ub(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          if (1.0 <= (double)in_stack_ffffffffffffff78) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff78);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_58);
        }
        in_stack_ffffffffffffff70 =
             (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                                *)(local_10 + 0x28));
        std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000010,in_stack_00000008);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80);
      }
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IfPreproNestedAndsOrs
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)0x2199ef);
      if (bVar1) {
        IntegrateNested<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::OrId>>
                  (in_stack_00000020,in_stack_00000018);
      }
      CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>::
      GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                    *)(local_10 + 0x28));
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80);
      if (bVar1) {
        PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
        ::narrow_result_bounds
                  (in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
                   (double)in_stack_ffffffffffffff70);
      }
      pAVar2 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
               ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                               *)(local_10 + 0x28));
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pAVar2);
      if (sVar3 == 1) {
        pAVar2 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                 ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                                 *)(local_10 + 0x28));
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pAVar2,0);
        PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
        ::set_result_var(local_18,*pvVar4);
      }
    }
  }
  else {
    PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
    ::narrow_result_bounds
              (in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
               (double)in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void PreprocessConstraint(
      OrConstraint& con, PreprocessInfo& prepro) {
    prepro.narrow_result_bounds(0.0, 1.0);
    prepro.set_result_type( var::INTEGER );
    // Remove fixed variables for XPRESS (solvers/#61).
    auto n01 = count_fixed_01(con.GetArguments());
    if (n01.second) {               // OR = true
      prepro.narrow_result_bounds(1.0, 1.0);
      return;
    }
    if ((int)con.GetArguments().size() == n01.first) {
      prepro.narrow_result_bounds(0.0, 0.0);
      return;
    }
    if (n01.first) {
      std::vector<int> arg1;
      arg1.reserve(con.GetArguments().size() - n01.first);
      for (auto x: con.GetArguments()) {
        if (MPCD( ub(x) ) >= 1.0)    // not fixed
          arg1.push_back(x);
      }
      con.GetArguments() = arg1;
    }
    if (MPCD( IfPreproNestedAndsOrs() ))
      IntegrateNested(con);            // flatten nested
    if (con.GetArguments().empty())
      prepro.narrow_result_bounds(0.0, 0.0);  // empty disjunction
    if (1 == con.GetArguments().size())
      prepro.set_result_var(con.GetArguments()[0]);
  }